

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O0

void __thiscall CreditCard::performPayment(CreditCard *this)

{
  ostream *poVar1;
  long lVar2;
  double dVar3;
  string local_68;
  string local_38 [8];
  string expDate;
  long number;
  CreditCard *this_local;
  
  std::__cxx11::string::string(local_38);
  std::operator<<((ostream *)&std::cout,"Enter Credit Card Number (Without Space): ");
  std::istream::operator>>((istream *)&std::cin,(long *)(expDate.field_2._M_local_buf + 8));
  std::operator<<((ostream *)&std::cout,"Enter Credit Expiry Date (Without Space) ");
  std::operator>>((istream *)&std::cin,local_38);
  setNumber(this,expDate.field_2._8_8_);
  std::__cxx11::string::string((string *)&local_68,local_38);
  setExpDate(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  dVar3 = Payment::getAmount(&this->super_Payment);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar3);
  poVar1 = std::operator<<(poVar1," is paid with credit card with ");
  lVar2 = getNumber(this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar2);
  poVar1 = std::operator<<(poVar1," number");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void CreditCard::performPayment() {
    long number;
    string expDate;

    cout << "Enter Credit Card Number (Without Space): ";
    cin >> number;
    cout << "Enter Credit Expiry Date (Without Space) ";
    cin >> expDate;
    setNumber(number);
    setExpDate(expDate);

    cout << getAmount() << " is paid with credit card with " << getNumber() << " number" << endl;
}